

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_eval.cc
# Opt level: O1

void EXPLORE_EVAL::finish(explore_eval *data)

{
  ostream *poVar1;
  vw_ostream *pvVar2;
  
  if (data->all->quiet == false) {
    pvVar2 = &data->all->trace_message;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar2->super_ostream,"update count = ",0xf)
    ;
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)pvVar2);
    std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if (data->violations != 0) {
      pvVar2 = &data->all->trace_message;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pvVar2->super_ostream,"violation count = ",0x12);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)pvVar2);
      std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
    }
    if (data->fixed_multiplier == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&(data->all->trace_message).super_ostream,"final multiplier = ",0x13);
      poVar1 = std::ostream::_M_insert<double>((double)data->multiplier);
      std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      return;
    }
  }
  return;
}

Assistant:

void finish(explore_eval& data)
{
  if (!data.all->quiet)
  {
    data.all->trace_message << "update count = " << data.update_count << endl;
    if (data.violations > 0)
      data.all->trace_message << "violation count = " << data.violations << endl;
    if (!data.fixed_multiplier)
      data.all->trace_message << "final multiplier = " << data.multiplier << endl;
  }
}